

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  char *__dest;
  ImGuiContext *pIVar1;
  char *pcVar2;
  char *pcVar3;
  ImGuiSettingsHandler *pIVar4;
  void *pvVar5;
  ImGuiSettingsHandler *handler;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  
  pIVar1 = GImGui;
  if (ini_size == 0) {
    ini_size = strlen(ini_data);
  }
  ImVector<char>::resize(&(pIVar1->SettingsIniData).Buf,(int)ini_size + 1);
  __dest = (pIVar1->SettingsIniData).Buf.Data;
  memcpy(__dest,ini_data,ini_size);
  __dest[ini_size] = '\0';
  pIVar4 = (pIVar1->SettingsHandlers).Data;
  for (lVar6 = (long)(pIVar1->SettingsHandlers).Size * 0x48; lVar6 != 0; lVar6 = lVar6 + -0x48) {
    if (pIVar4->ReadInitFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      (*pIVar4->ReadInitFn)(pIVar1,pIVar4);
    }
    pIVar4 = pIVar4 + 1;
  }
  pIVar4 = (ImGuiSettingsHandler *)0x0;
  pvVar5 = (void *)0x0;
  pcVar8 = __dest;
  while (pcVar8 < __dest + ini_size) {
    for (; (*pcVar8 == '\n' || (pcVar7 = pcVar8, *pcVar8 == '\r')); pcVar8 = pcVar8 + 1) {
    }
    for (; ((pcVar7 < __dest + ini_size && (*pcVar7 != '\n')) && (*pcVar7 != '\r'));
        pcVar7 = pcVar7 + 1) {
    }
    *pcVar7 = '\0';
    if (*pcVar8 != ';') {
      if (((*pcVar8 == '[') && (pcVar8 < pcVar7)) && (pcVar7[-1] == ']')) {
        pcVar3 = pcVar7 + -1;
        *pcVar3 = '\0';
        pcVar2 = ImStrchrRange(pcVar8 + 1,pcVar3,']');
        if ((pcVar2 != (char *)0x0) &&
           (pcVar3 = ImStrchrRange(pcVar2 + 1,pcVar3,'['), pcVar3 != (char *)0x0)) {
          *pcVar2 = '\0';
          pIVar4 = FindSettingsHandler(pcVar8 + 1);
          if (pIVar4 == (ImGuiSettingsHandler *)0x0) {
            pIVar4 = (ImGuiSettingsHandler *)0x0;
            pvVar5 = (void *)0x0;
          }
          else {
            pvVar5 = (*pIVar4->ReadOpenFn)(pIVar1,pIVar4,pcVar3 + 1);
          }
        }
      }
      else if ((pIVar4 != (ImGuiSettingsHandler *)0x0) && (pvVar5 != (void *)0x0)) {
        (*pIVar4->ReadLineFn)(pIVar1,pIVar4,pvVar5,pcVar8);
      }
    }
    pcVar8 = pcVar7 + 1;
  }
  pIVar1->SettingsLoaded = true;
  memcpy(__dest,ini_data,ini_size);
  pIVar4 = (pIVar1->SettingsHandlers).Data;
  for (lVar6 = (long)(pIVar1->SettingsHandlers).Size * 0x48; lVar6 != 0; lVar6 = lVar6 + -0x48) {
    if (pIVar4->ApplyAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      (*pIVar4->ApplyAllFn)(pIVar1,pIVar4);
    }
    pIVar4 = pIVar4 + 1;
  }
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    //IM_ASSERT(!g.WithinFrameScope && "Cannot be called between NewFrame() and EndFrame()");
    //IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    g.SettingsIniData.Buf.resize((int)ini_size + 1);
    char* const buf = g.SettingsIniData.Buf.Data;
    char* const buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf_end[0] = 0;

    // Call pre-read handlers
    // Some types will clear their data (e.g. dock information) some types will allow merge/override (window)
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ReadInitFn != NULL)
            handler.ReadInitFn(&g, &handler);

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    g.SettingsLoaded = true;

    // [DEBUG] Restore untouched copy so it can be browsed in Metrics (not strictly necessary)
    memcpy(buf, ini_data, ini_size);

    // Call post-read handlers
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ApplyAllFn != NULL)
            handler.ApplyAllFn(&g, &handler);
}